

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::ValueExpressionBase::checkVariableAssignment
          (ValueExpressionBase *this,ASTContext *context,VariableSymbol *var,
          bitmask<slang::ast::AssignFlags> flags,SourceLocation assignLoc,SourceRange varRange)

{
  bool bVar1;
  bool bVar2;
  Scope *this_00;
  Expression *pEVar3;
  SubroutineSymbol *pSVar4;
  undefined4 in_register_0000000c;
  bool local_b9;
  bitmask<slang::ast::AssignFlags> local_a8;
  undefined4 local_a4;
  bitmask<slang::ast::AssignFlags> local_a0;
  undefined4 local_9c;
  ClockVarSymbol *local_98;
  ClockVarSymbol *cv;
  bitmask<slang::ast::AssignFlags> local_88;
  undefined4 local_84;
  bitmask<slang::ast::AssignFlags> local_80;
  undefined4 local_7a;
  underlying_type_t<slang::ast::MethodFlags> local_76;
  bitmask<slang::ast::MethodFlags> local_74;
  bitmask<slang::ast::MethodFlags> local_72;
  Scope *local_70;
  Scope *parentScope;
  Symbol *parent;
  undefined1 local_58 [8];
  anon_class_32_4_231050bc reportErr;
  VariableSymbol *var_local;
  ASTContext *context_local;
  SourceRange varRange_local;
  SourceLocation assignLoc_local;
  bitmask<slang::ast::AssignFlags> flags_local;
  
  varRange_local.endLoc._4_4_ = in_register_0000000c;
  varRange_local.endLoc._0_4_ = flags.m_bits;
  assignLoc_local._0_4_ = SUB84(var,0);
  local_58 = (undefined1  [8])&varRange_local.endLoc;
  reportErr.assignLoc = (SourceLocation *)&context_local;
  reportErr.varRange = (SourceRange *)this;
  reportErr.context = context;
  reportErr.var = (VariableSymbol *)context;
  context_local = (ASTContext *)assignLoc;
  bitmask<slang::ast::VariableFlags>::bitmask
            ((bitmask<slang::ast::VariableFlags> *)((long)&parent + 6),Const);
  bVar1 = bitmask<slang::ast::VariableFlags>::has
                    ((bitmask<slang::ast::VariableFlags> *)((long)&context[2].instanceOrProc + 4),
                     (bitmask<slang::ast::VariableFlags> *)((long)&parent + 6));
  if (bVar1) {
    this_00 = not_null<const_slang::ast::Scope_*>::operator->
                        ((not_null<const_slang::ast::Scope_*> *)this);
    parentScope = (Scope *)Scope::asSymbol(this_00);
    while (*(int *)&parentScope->compilation == 0x38) {
      local_70 = Symbol::getParentScope((Symbol *)parentScope);
      if (local_70 == (Scope *)0x0) {
        assert::assertFailed
                  ("parentScope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/MiscExpressions.cpp"
                   ,200,
                   "static bool slang::ast::ValueExpressionBase::checkVariableAssignment(const ASTContext &, const VariableSymbol &, bitmask<AssignFlags>, SourceLocation, SourceRange)"
                  );
      }
      parentScope = (Scope *)Scope::asSymbol(local_70);
    }
    pEVar3 = ValueSymbol::getInitializer(&(reportErr.var)->super_ValueSymbol);
    local_b9 = true;
    if ((pEVar3 == (Expression *)0x0) &&
       (local_b9 = true, *(int *)&parentScope->compilation == 0x3e)) {
      pSVar4 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)parentScope);
      bitmask<slang::ast::MethodFlags>::bitmask(&local_74,Constructor);
      local_72 = bitmask<slang::ast::MethodFlags>::operator&(&pSVar4->flags,&local_74);
      local_76 = 0;
      local_b9 = slang::operator==(&local_72,&local_76);
    }
    if (local_b9 != false) {
      local_7a = 0x170007;
      bVar1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                        ((anon_class_32_4_231050bc *)local_58,(DiagCode)0x170007);
      return bVar1;
    }
  }
  bitmask<slang::ast::AssignFlags>::bitmask(&local_80,NonBlocking);
  bVar2 = bitmask<slang::ast::AssignFlags>::has
                    ((bitmask<slang::ast::AssignFlags> *)&assignLoc_local,&local_80);
  bVar1 = false;
  if ((bVar2) && (bVar1 = false, (reportErr.var)->lifetime == Automatic)) {
    bVar1 = ((reportErr.var)->super_ValueSymbol).super_Symbol.kind != ClassProperty;
  }
  if (bVar1) {
    local_84 = 0x720007;
    bVar1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                      ((anon_class_32_4_231050bc *)local_58,(DiagCode)0x720007);
    return bVar1;
  }
  if (((reportErr.var)->super_ValueSymbol).super_Symbol.kind == ClockVar) {
    bitmask<slang::ast::AssignFlags>::bitmask(&local_88,InConcat);
    bVar1 = bitmask<slang::ast::AssignFlags>::has
                      ((bitmask<slang::ast::AssignFlags> *)&assignLoc_local,&local_88);
    if (bVar1) {
      cv._4_4_ = 0x360007;
      checkVariableAssignment::anon_class_32_4_231050bc::operator()
                ((anon_class_32_4_231050bc *)local_58,(DiagCode)0x360007);
    }
    local_98 = Symbol::as<slang::ast::ClockVarSymbol>((Symbol *)reportErr.var);
    if (local_98->direction == In) {
      local_9c = 0x4b0008;
      bVar1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                        ((anon_class_32_4_231050bc *)local_58,(DiagCode)0x4b0008);
      return bVar1;
    }
    bitmask<slang::ast::AssignFlags>::bitmask(&local_a0,NonBlocking);
    bVar1 = bitmask<slang::ast::AssignFlags>::has
                      ((bitmask<slang::ast::AssignFlags> *)&assignLoc_local,&local_a0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_a4 = 0x90008;
      bVar1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                        ((anon_class_32_4_231050bc *)local_58,(DiagCode)0x90008);
      return bVar1;
    }
  }
  bitmask<slang::ast::AssignFlags>::bitmask(&local_a8,InOutPort);
  bVar1 = bitmask<slang::ast::AssignFlags>::has
                    ((bitmask<slang::ast::AssignFlags> *)&assignLoc_local,&local_a8);
  if (bVar1) {
    assignLoc_local._7_1_ =
         checkVariableAssignment::anon_class_32_4_231050bc::operator()
                   ((anon_class_32_4_231050bc *)local_58,(DiagCode)0x4f0007);
  }
  else {
    assignLoc_local._7_1_ = 1;
  }
  return (bool)assignLoc_local._7_1_;
}

Assistant:

bool ValueExpressionBase::checkVariableAssignment(const ASTContext& context,
                                                  const VariableSymbol& var,
                                                  bitmask<AssignFlags> flags,
                                                  SourceLocation assignLoc, SourceRange varRange) {
    auto reportErr = [&](DiagCode code) {
        if (!assignLoc)
            assignLoc = varRange.start();

        auto& diag = context.addDiag(code, assignLoc);
        diag.addNote(diag::NoteDeclarationHere, var.location);
        diag << var.name << varRange;
        return false;
    };

    if (var.flags.has(VariableFlags::Const)) {
        // If we are in a class constructor and this variable does not have an initializer,
        // it's ok to assign to it.
        const Symbol* parent = &context.scope->asSymbol();
        while (parent->kind == SymbolKind::StatementBlock) {
            auto parentScope = parent->getParentScope();
            ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (var.getInitializer() || parent->kind != SymbolKind::Subroutine ||
            (parent->as<SubroutineSymbol>().flags & MethodFlags::Constructor) == 0) {
            return reportErr(diag::AssignmentToConstVar);
        }
    }

    if (flags.has(AssignFlags::NonBlocking) && var.lifetime == VariableLifetime::Automatic &&
        var.kind != SymbolKind::ClassProperty) {
        return reportErr(diag::NonblockingAssignmentToAuto);
    }

    if (var.kind == SymbolKind::ClockVar) {
        if (flags.has(AssignFlags::InConcat))
            reportErr(diag::ClockVarAssignConcat);

        auto& cv = var.as<ClockVarSymbol>();
        if (cv.direction == ArgumentDirection::In)
            return reportErr(diag::WriteToInputClockVar);

        if (!flags.has(AssignFlags::NonBlocking))
            return reportErr(diag::ClockVarSyncDrive);
    }

    if (flags.has(AssignFlags::InOutPort))
        return reportErr(diag::InOutVarPortConn);

    return true;
}